

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O1

Expression * __thiscall soul::StructuralParser::parseFactor(StructuralParser *this)

{
  char *__s1;
  bool bVar1;
  int iVar2;
  Handle h;
  Expression *pEVar3;
  QualifiedIdentifier *expression;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 uVar4;
  char *v;
  Value *this_00;
  complex<double> v_00;
  string_view text;
  pool_ptr<soul::AST::Expression> type;
  undefined1 local_260 [72];
  Value local_218;
  Value local_1d8;
  Value local_198;
  Value local_158;
  Value local_118;
  Value local_d8;
  Value local_98;
  Value local_58;
  
  v = "(";
  bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x288ebc);
  if (bVar1) {
    pEVar3 = parseParenthesisedExpression(this);
    return pEVar3;
  }
  __s1 = (this->super_SOULTokeniser).currentType.text;
  if (__s1 == "$integer32") {
LAB_001da058:
    soul::Value::Value(&local_58,(int32_t)(this->super_SOULTokeniser).literalIntValue);
    pEVar3 = createLiteral(this,&local_58);
    this_00 = &local_58;
    goto LAB_001da20b;
  }
  uVar4 = extraout_RDX;
  if (__s1 != (char *)0x0) {
    v = "$integer32";
    iVar2 = strcmp(__s1,"$integer32");
    uVar4 = extraout_RDX_00;
    if (iVar2 == 0) goto LAB_001da058;
  }
  if (__s1 == "$integer64") {
LAB_001da086:
    soul::Value::Value(&local_98,(this->super_SOULTokeniser).literalIntValue);
    pEVar3 = createLiteral(this,&local_98);
    this_00 = &local_98;
    goto LAB_001da20b;
  }
  if (__s1 != (char *)0x0) {
    v = "$integer64";
    iVar2 = strcmp(__s1,"$integer64");
    uVar4 = extraout_RDX_01;
    if (iVar2 == 0) goto LAB_001da086;
  }
  if (__s1 == "$float64") {
LAB_001da0b5:
    soul::Value::Value(&local_d8,(this->super_SOULTokeniser).literalDoubleValue);
    pEVar3 = createLiteral(this,&local_d8);
    this_00 = &local_d8;
    goto LAB_001da20b;
  }
  if (__s1 != (char *)0x0) {
    v = "$float64";
    iVar2 = strcmp(__s1,"$float64");
    uVar4 = extraout_RDX_02;
    if (iVar2 == 0) goto LAB_001da0b5;
  }
  if (__s1 == "$float32") {
LAB_001da0e5:
    soul::Value::Value(&local_118,(float)(this->super_SOULTokeniser).literalDoubleValue);
    pEVar3 = createLiteral(this,&local_118);
    this_00 = &local_118;
    goto LAB_001da20b;
  }
  if (__s1 != (char *)0x0) {
    v = "$float32";
    iVar2 = strcmp(__s1,"$float32");
    uVar4 = extraout_RDX_03;
    if (iVar2 == 0) goto LAB_001da0e5;
  }
  if (__s1 == "$imag32") {
LAB_001da115:
    soul::Value::Value(&local_158,(complex<float>)v);
    pEVar3 = createLiteral(this,&local_158);
    this_00 = &local_158;
    goto LAB_001da20b;
  }
  if (__s1 != (char *)0x0) {
    v = "$imag32";
    iVar2 = strcmp(__s1,"$imag32");
    uVar4 = extraout_RDX_04;
    if (iVar2 == 0) goto LAB_001da115;
  }
  if (__s1 == "$imag64") {
LAB_001da150:
    v_00._M_value._8_8_ = uVar4;
    v_00._M_value._0_8_ = v;
    soul::Value::Value(&local_198,v_00);
    pEVar3 = createLiteral(this,&local_198);
    this_00 = &local_198;
  }
  else {
    if (__s1 != (char *)0x0) {
      v = "$imag64";
      iVar2 = strcmp(__s1,"$imag64");
      uVar4 = extraout_RDX_05;
      if (iVar2 == 0) goto LAB_001da150;
    }
    if ((__s1 == "$string literal") ||
       ((__s1 != (char *)0x0 && (iVar2 = strcmp(__s1,"$string literal"), iVar2 == 0)))) {
      text._M_str = (this->super_SOULTokeniser).currentStringValue._M_dataplus._M_p;
      text._M_len = (this->super_SOULTokeniser).currentStringValue._M_string_length;
      h = StringDictionary::getHandleForString(&this->allocator->stringDictionary,text);
      soul::Value::createStringLiteral(&local_1d8,h);
      pEVar3 = createLiteral(this,&local_1d8);
      this_00 = &local_1d8;
    }
    else if ((__s1 == "true") ||
            ((__s1 != (char *)0x0 && (iVar2 = strcmp(__s1,"true"), iVar2 == 0)))) {
      soul::Value::Value(&local_218,true);
      pEVar3 = createLiteral(this,&local_218);
      this_00 = &local_218;
    }
    else {
      if ((__s1 != "false") && ((__s1 == (char *)0x0 || (iVar2 = strcmp(__s1,"false"), iVar2 != 0)))
         ) {
        bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2852bf);
        if (bVar1) {
          pEVar3 = &parseProcessorProperty(this)->super_Expression;
          return pEVar3;
        }
        tryParsingType((StructuralParser *)local_260,(ParseTypeContext)this);
        if ((Expression *)local_260._0_8_ == (Expression *)0x0) {
          expression = parseQualifiedIdentifier(this);
          pEVar3 = parseSuffixes(this,&expression->super_Expression);
          return pEVar3;
        }
        pEVar3 = parseSuffixes(this,(Expression *)local_260._0_8_);
        return pEVar3;
      }
      soul::Value::Value((Value *)(local_260 + 8),false);
      pEVar3 = createLiteral(this,(Value *)(local_260 + 8));
      this_00 = (Value *)(local_260 + 8);
    }
  }
LAB_001da20b:
  soul::Value::~Value(this_00);
  return pEVar3;
}

Assistant:

AST::Expression& parseFactor()
    {
        if (matchIf (Operator::openParen))     return parseParenthesisedExpression();
        if (matches (Token::literalInt32))     return createLiteral (Value::createInt32 (literalIntValue));
        if (matches (Token::literalInt64))     return createLiteral (Value::createInt64 (literalIntValue));
        if (matches (Token::literalFloat64))   return createLiteral (Value (literalDoubleValue));
        if (matches (Token::literalFloat32))   return createLiteral (Value (static_cast<float> (literalDoubleValue)));
        if (matches (Token::literalImag32))    return createLiteral (Value (std::complex (0.0f, static_cast<float> (literalDoubleValue))));
        if (matches (Token::literalImag64))    return createLiteral (Value (std::complex (0.0, static_cast<double> (literalDoubleValue))));
        if (matches (Token::literalString))    return createLiteral (Value::createStringLiteral (allocator.stringDictionary.getHandleForString (currentStringValue)));
        if (matches (Keyword::true_))          return createLiteral (Value (true));
        if (matches (Keyword::false_))         return createLiteral (Value (false));
        if (matchIf (Keyword::processor))      return parseProcessorProperty();

        if (auto type = tryParsingType (ParseTypeContext::nameOrType))
            return parseSuffixes (*type);

        return parseSuffixes (parseQualifiedIdentifier());
    }